

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void helics::addFields(string_view key,string_view typeName,InterfaceHandle hid,MapType *searchMap,
                      AliasT aliases)

{
  key_type *pkVar1;
  iterator iVar2;
  runtime_error *prVar3;
  key_type *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar4;
  allocator<char> local_12f;
  allocator<char> local_12e;
  allocator<char> local_12d;
  InterfaceHandle hid_local;
  string_view typeName_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view key_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  key_local._M_str = key._M_str;
  key_local._M_len = key._M_len;
  typeName_local._M_str = typeName._M_str;
  typeName_local._M_len = typeName._M_len;
  hid_local = hid;
  pVar4 = std::
          unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
          ::try_emplace<helics::InterfaceHandle&>
                    ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
                      *)searchMap,&key_local,&hid_local);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"duplicate ",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_118,
               (basic_string_view<char,_std::char_traits<char>_> *)&typeName_local,
               (allocator<char> *)&local_98);
    std::operator+(&local_d8,&local_f8,&local_118);
    std::operator+(&local_b8,&local_d8," key found");
    std::runtime_error::runtime_error(prVar3,(string *)&local_b8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)aliases._M_h._M_buckets,&key_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pkVar1 = *(key_type **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                     ._M_cur + 0x20);
    for (__k = *(key_type **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                       ._M_cur + 0x18); __k != pkVar1; __k = __k + 1) {
      pVar4 = std::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
              ::try_emplace<helics::InterfaceHandle&>
                        ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
                          *)searchMap,__k,&hid_local);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"duplicate ",&local_12d);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_98,
                   (basic_string_view<char,_std::char_traits<char>_> *)&typeName_local,&local_12e);
        std::operator+(&local_118,&local_78,&local_98);
        std::operator+(&local_f8,&local_118," alias key(");
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_48,(basic_string_view<char,_std::char_traits<char>_> *)__k,
                   &local_12f);
        std::operator+(&local_d8,&local_f8,&local_48);
        std::operator+(&local_b8,&local_d8,") found");
        std::runtime_error::runtime_error(prVar3,(string *)&local_b8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

static void addFields(std::string_view key,
                      std::string_view typeName,
                      InterfaceHandle hid,
                      MapType& searchMap,
                      AliasT aliases)
{
    auto placed = searchMap.try_emplace(key, hid);
    if (!placed.second) {
        throw std::runtime_error(std::string("duplicate ") + std::string(typeName) + " key found");
    }
    auto aliasRange = aliases.find(key);
    if (aliasRange != aliases.end()) {
        for (auto& alias : aliasRange->second) {
            placed = searchMap.try_emplace(alias, hid);
            if (!placed.second) {
                throw std::runtime_error(std::string("duplicate ") + std::string(typeName) +
                                         " alias key(" + std::string(alias) + ") found");
            }
        }
    }
}